

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatasetBuilder.cpp
# Opt level: O0

bool __thiscall DatasetBuilder::can_still_add(DatasetBuilder *this,uint64_t bytes)

{
  anon_class_16_2_e3213a55 __pred;
  bool bVar1;
  __normal_iterator<const_std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_*,_std::vector<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>_>
  __last;
  const_iterator cVar2;
  unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_> *in_RSI;
  vector<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>
  *in_RDI;
  anon_class_16_2_e3213a55 can_add_bytes;
  __normal_iterator<const_std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_*,_std::vector<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>_>
  __first;
  
  __first._M_current = in_RSI;
  __last._M_current =
       (unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&in_RDI[1].
                  super__Vector_base<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
  cVar2 = std::
          cbegin<std::vector<std::unique_ptr<IndexBuilder,std::default_delete<IndexBuilder>>,std::allocator<std::unique_ptr<IndexBuilder,std::default_delete<IndexBuilder>>>>>
                    (in_RDI);
  std::
  cend<std::vector<std::unique_ptr<IndexBuilder,std::default_delete<IndexBuilder>>,std::allocator<std::unique_ptr<IndexBuilder,std::default_delete<IndexBuilder>>>>>
            (in_RDI);
  __pred.fcount = (size_type)in_RSI;
  __pred.bytes = (uint64_t)cVar2._M_current;
  bVar1 = std::
          all_of<__gnu_cxx::__normal_iterator<std::unique_ptr<IndexBuilder,std::default_delete<IndexBuilder>>const*,std::vector<std::unique_ptr<IndexBuilder,std::default_delete<IndexBuilder>>,std::allocator<std::unique_ptr<IndexBuilder,std::default_delete<IndexBuilder>>>>>,DatasetBuilder::can_still_add(unsigned_long)const::__0>
                    (__first,__last,__pred);
  return bVar1;
}

Assistant:

bool DatasetBuilder::can_still_add(uint64_t bytes) const {
    auto can_add_bytes = [bytes, fcount = fids.size()](const auto &ndx) {
        return ndx->can_still_add(bytes, fcount);
    };
    return std::all_of(std::cbegin(indices), std::cend(indices), can_add_bytes);
}